

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O0

void vkt::synchronization::anon_unknown_0::buildShaders(SourceCollections *shaderCollection)

{
  SourceCollections *this;
  ProgramSources *pPVar1;
  allocator<char> local_109;
  string local_108;
  ShaderSource local_e8;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  ShaderSource local_70;
  allocator<char> local_31;
  string local_30;
  SourceCollections *local_10;
  SourceCollections *shaderCollection_local;
  
  local_10 = shaderCollection;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"glslvert",&local_31);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&shaderCollection->glslSources,&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "#version 310 es\nprecision mediump float;\nlayout (location = 0) in vec4 vertexPosition;\nvoid main()\n{\n\tgl_Position = vertexPosition;\n}\n"
             ,&local_91);
  glu::VertexSource::VertexSource((VertexSource *)&local_70,&local_90);
  glu::ProgramSources::operator<<(pPVar1,&local_70);
  glu::VertexSource::~VertexSource((VertexSource *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"glslfrag",&local_b9);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this->glslSources,&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,
             "#version 310 es\nprecision mediump float;\nlayout (location = 0) out vec4 outputColor;\nvoid main()\n{\n\toutputColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
             ,&local_109);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_e8,&local_108);
  glu::ProgramSources::operator<<(pPVar1,&local_e8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  return;
}

Assistant:

void buildShaders (SourceCollections& shaderCollection)
{
	shaderCollection.glslSources.add("glslvert") <<
		glu::VertexSource(
				"#version 310 es\n"
				"precision mediump float;\n"
				"layout (location = 0) in vec4 vertexPosition;\n"
				"void main()\n"
				"{\n"
				"	gl_Position = vertexPosition;\n"
				"}\n");

	shaderCollection.glslSources.add("glslfrag") <<
		glu::FragmentSource(
				"#version 310 es\n"
				"precision mediump float;\n"
				"layout (location = 0) out vec4 outputColor;\n"
				"void main()\n"
				"{\n"
				"	outputColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
				"}\n");
}